

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O0

Status * __thiscall draco::PointCloudDecoder::DecodeStep2(PointCloudDecoder *this)

{
  ulong uVar1;
  long *in_RSI;
  Status *in_RDI;
  Code in_stack_ffffffffffffff9c;
  Status *this_00;
  allocator<char> local_31;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  uVar1 = (**(code **)(*in_RSI + 0x38))();
  if ((uVar1 & 1) == 0) {
    this_00 = (Status *)&local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    Status::Status(this_00,in_stack_ffffffffffffff9c,(string *)0x183f79);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    std::allocator<char>::~allocator(&local_31);
  }
  else {
    OkStatus();
  }
  return in_RDI;
}

Assistant:

Status PointCloudDecoder::DecodeStep2() {
  if (!DecodePointAttributesStep2()) {
    return Status(Status::DRACO_ERROR, "Failed to decode point attributes.");
  }
  return OkStatus();
}